

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

void Abc_NodePrintKMap(Abc_Obj_t *pNode,int fUseRealNames)

{
  DdManager *pDVar1;
  DdNode *pDVar2;
  void *pvVar3;
  FILE *pFVar4;
  int iVar5;
  Vec_Ptr_t *vNames;
  Vec_Ptr_t *vNamesIn;
  int fUseRealNames_local;
  Abc_Obj_t *pNode_local;
  
  pFVar4 = _stdout;
  if (fUseRealNames == 0) {
    pDVar1 = (DdManager *)pNode->pNtk->pManFunc;
    pDVar2 = (DdNode *)(pNode->field_5).pData;
    pvVar3 = (pNode->field_5).pData;
    iVar5 = Abc_ObjFaninNum(pNode);
    Extra_PrintKMap(pFVar4,pDVar1,pDVar2,(DdNode *)((ulong)pvVar3 ^ 1),iVar5,(DdNode **)0x0,0,
                    (char **)0x0);
  }
  else {
    vNames = Abc_NodeGetFaninNames(pNode);
    pFVar4 = _stdout;
    pDVar1 = (DdManager *)pNode->pNtk->pManFunc;
    pDVar2 = (DdNode *)(pNode->field_5).pData;
    pvVar3 = (pNode->field_5).pData;
    iVar5 = Abc_ObjFaninNum(pNode);
    Extra_PrintKMap(pFVar4,pDVar1,pDVar2,(DdNode *)((ulong)pvVar3 ^ 1),iVar5,(DdNode **)0x0,0,
                    (char **)vNames->pArray);
    Abc_NodeFreeNames(vNames);
  }
  return;
}

Assistant:

void Abc_NodePrintKMap( Abc_Obj_t * pNode, int fUseRealNames )
{
#ifdef ABC_USE_CUDD
    Vec_Ptr_t * vNamesIn;
    if ( fUseRealNames )
    {
        vNamesIn = Abc_NodeGetFaninNames(pNode);
        Extra_PrintKMap( stdout, (DdManager *)pNode->pNtk->pManFunc, (DdNode *)pNode->pData, Cudd_Not(pNode->pData),
            Abc_ObjFaninNum(pNode), NULL, 0, (char **)vNamesIn->pArray );
        Abc_NodeFreeNames( vNamesIn );
    }
    else
        Extra_PrintKMap( stdout, (DdManager *)pNode->pNtk->pManFunc, (DdNode *)pNode->pData, Cudd_Not(pNode->pData),
            Abc_ObjFaninNum(pNode), NULL, 0, NULL );
#endif
}